

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O1

Error asmjit::X86Logging::formatRegister
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                uint32_t rType,uint32_t rId)

{
  char *str;
  bool bVar1;
  Error in_EAX;
  Error EVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  ulong uVar4;
  char *fmt;
  
  if (rId < 0x100) {
    fmt = "PhysReg<Type=%u Id=%u>";
    if (rType < 0x20) {
      uVar3 = (ulong)rType;
      if (rId < (byte)x86RegFormatInfo[uVar3 * 4 + 3]) {
        EVar2 = StringBuilder::_opString
                          (sb,1,x86RegFormatStrings +
                                (ulong)rId * 4 + (ulong)(byte)x86RegFormatInfo[uVar3 * 4 + 2],
                           0xffffffffffffffff);
        bVar1 = false;
      }
      else if (rId < (byte)x86RegFormatInfo[uVar3 * 4]) {
        bVar1 = false;
        EVar2 = StringBuilder::appendFormat
                          (sb,x86RegFormatStrings + (byte)x86RegFormatInfo[uVar3 * 4 + 1],(ulong)rId
                          );
      }
      else {
        bVar1 = true;
        EVar2 = rType;
      }
      if (!bVar1) {
        return EVar2;
      }
    }
  }
  else {
    fmt = "VirtReg<Type=%u Id=%u>";
    if ((emitter != (CodeEmitter *)0x0) && (emitter->_type == '\x03')) {
      uVar4 = (ulong)(rId - 0x100);
      uVar3 = *(ulong *)&emitter[3]._none.field_0;
      if (uVar4 < uVar3) {
        if (rId == 0xffffffff) {
          formatRegister();
LAB_0016432e:
          formatRegister();
        }
        if (*(long *)(emitter[3]._inlineComment + uVar4 * 8) == 0) goto LAB_0016432e;
        str = *(char **)(*(long *)(emitter[3]._inlineComment + uVar4 * 8) + 8);
        if ((str == (char *)0x0) || (*str == '\0')) {
          in_EAX = StringBuilder::appendFormat
                             (sb,"v%u",uVar4,CONCAT44(in_register_0000000c,archType));
        }
        else {
          in_EAX = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
        }
      }
      if (uVar4 < uVar3) {
        return in_EAX;
      }
    }
  }
  EVar2 = StringBuilder::appendFormat(sb,fmt,(ulong)rType,(ulong)rId);
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Logging::formatRegister(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  uint32_t rType,
  uint32_t rId) noexcept {

  ASMJIT_UNUSED(logOptions);
  ASMJIT_UNUSED(archType);

  if (Operand::isPackedId(rId)) {
#if !defined(ASMJIT_DISABLE_COMPILER)
    if (emitter && emitter->getType() == CodeEmitter::kTypeCompiler) {
      const CodeCompiler* cc = static_cast<const CodeCompiler*>(emitter);

      if (cc->isVirtRegValid(rId)) {
        VirtReg* vReg = cc->getVirtRegById(rId);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->getName();
        if (name && name[0] != '\0')
          return sb.appendString(name);
        else
          return sb.appendFormat("v%u", static_cast<unsigned int>(Operand::unpackId(rId)));
      }
    }
#endif // !ASMJIT_DISABLE_COMPILER

    return sb.appendFormat("VirtReg<Type=%u Id=%u>", rType, rId);
  }
  else {
    if (rType < ASMJIT_ARRAY_SIZE(x86RegFormatInfo)) {
      const X86RegFormatInfo& rfi = x86RegFormatInfo[rType];

      if (rId < rfi.specialCount)
        return sb.appendString(x86RegFormatStrings + rfi.specialIndex + rId * 4);

      if (rId < rfi.count)
        return sb.appendFormat(x86RegFormatStrings + rfi.formatIndex, static_cast<unsigned int>(rId));
    }

    return sb.appendFormat("PhysReg<Type=%u Id=%u>", rType, rId);
  }
}